

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InstrumentPass::NewLabel(InstrumentPass *this,uint32_t label_id)

{
  DefUseManager *this_00;
  type inst;
  undefined4 in_register_00000034;
  Pass *this_01;
  initializer_list<spvtools::opt::Operand> local_40;
  int local_30 [2];
  IRContext *local_28;
  undefined1 local_1d;
  uint local_1c;
  Pass *pPStack_18;
  uint32_t label_id_local;
  InstrumentPass *this_local;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *new_label;
  
  this_01 = (Pass *)CONCAT44(in_register_00000034,label_id);
  local_1d = 0;
  pPStack_18 = this_01;
  this_local = this;
  local_28 = Pass::context(this_01);
  local_30[1] = 0xf8;
  local_30[0] = 0;
  std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_40);
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)this,&local_28,(Op *)(local_30 + 1),local_30,&local_1c,&local_40);
  this_00 = Pass::get_def_use_mgr(this_01);
  inst = std::
         unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
         operator*((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)this);
  analysis::DefUseManager::AnalyzeInstDefUse(this_00,inst);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> InstrumentPass::NewLabel(uint32_t label_id) {
  auto new_label =
      MakeUnique<Instruction>(context(), spv::Op::OpLabel, 0, label_id,
                              std::initializer_list<Operand>{});
  get_def_use_mgr()->AnalyzeInstDefUse(&*new_label);
  return new_label;
}